

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::SetCacheEntryValue(cmState *this,string *key,string *value)

{
  CacheIterator local_18;
  
  local_18 = cmCacheManager::GetCacheIterator(this->CacheManager,(key->_M_dataplus)._M_p);
  cmCacheManager::CacheIterator::SetValue(&local_18,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void cmState::SetCacheEntryValue(std::string const& key,
                                 std::string const& value)
{
  this->CacheManager->SetCacheEntryValue(key, value);
}